

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

void __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::GetListValues
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *this,idx_t row_idx,TYPE *start_value,
          TYPE *end_value,INCREMENT_TYPE *increment_value)

{
  TYPE TVar1;
  INCREMENT_TYPE IVar2;
  
  TVar1 = StartListValue(this,row_idx);
  start_value->value = (int64_t)TVar1;
  TVar1 = EndListValue(this,row_idx);
  end_value->value = (int64_t)TVar1;
  IVar2 = ListIncrementValue(this,row_idx);
  *increment_value = IVar2;
  return;
}

Assistant:

void GetListValues(idx_t row_idx, typename OP::TYPE &start_value, typename OP::TYPE &end_value,
	                   typename OP::INCREMENT_TYPE &increment_value) {
		start_value = StartListValue(row_idx);
		end_value = EndListValue(row_idx);
		increment_value = ListIncrementValue(row_idx);
	}